

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_defs.h
# Opt level: O2

uint __thiscall crnd::crn_packed_uint::operator_cast_to_unsigned_int(crn_packed_uint<4U> *this)

{
  uint uVar1;
  
  uVar1 = *(uint *)this->m_buf;
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

inline operator unsigned int() const
        {
            switch (N)
            {
            case 1:
                return m_buf[0];
            case 2:
                return (m_buf[0] << 8U) | m_buf[1];
            case 3:
                return (m_buf[0] << 16U) | (m_buf[1] << 8U) | (m_buf[2]);
            default:
                return (m_buf[0] << 24U) | (m_buf[1] << 16U) | (m_buf[2] << 8U) | (m_buf[3]);
            }
        }